

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkFile tonk_file_from_buffer
                   (TonkConnection connection,uint32_t channel,char *name,void *data,uint32_t bytes,
                   uint32_t flags)

{
  void *in_RCX;
  char *in_RDX;
  uint32_t in_ESI;
  TonkConnection in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  TonkFile local_8;
  
  if (fp_tonk_file_from_buffer == (fp_tonk_file_from_buffer_t)0x0) {
    local_8 = (TonkFile)0x0;
  }
  else {
    local_8 = (*fp_tonk_file_from_buffer)(in_RDI,in_ESI,in_RDX,in_RCX,in_R8D,in_R9D);
  }
  return local_8;
}

Assistant:

TonkFile tonk_file_from_buffer(
    TonkConnection connection,  ///< Connection to send on
    uint32_t          channel,  ///< Reliable channel for data
    const char*          name,  ///< Transfer name
    const void*          data,  ///< File buffer data pointer
    uint32_t            bytes,  ///< File buffer bytes to send
    uint32_t            flags   ///< Flags for buffer
)
{
    if (!fp_tonk_file_from_buffer) {
        return 0;
    }

    return fp_tonk_file_from_buffer(
        connection,
        channel,
        name,
        data,
        bytes,
        flags);
}